

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opaque.c
# Opt level: O2

exr_result_t
exr_attr_opaquedata_set_packed(exr_context_t ctxt,exr_attr_opaquedata_t *u,void *packed,int32_t sz)

{
  exr_result_t eVar1;
  void *__dest;
  code *UNRECOVERED_JUMPTABLE;
  undefined8 uStack_40;
  
  if (ctxt == (exr_context_t)0x0) {
    return 2;
  }
  if (u == (exr_attr_opaquedata_t *)0x0) {
    UNRECOVERED_JUMPTABLE = *(code **)(ctxt + 0x38);
    uStack_40 = 3;
  }
  else {
    if (sz < 0) {
      eVar1 = (**(code **)(ctxt + 0x48))
                        (ctxt,3,"Opaque data given invalid negative size (%d)",sz,
                         *(code **)(ctxt + 0x48));
      return eVar1;
    }
    __dest = (void *)(**(code **)(ctxt + 0x58))((ulong)(uint)sz);
    if (__dest != (void *)0x0) {
      if ((u->unpacked_data != (void *)0x0) &&
         (u->destroy_unpacked_func_ptr != (_func_void_exr_context_t_void_ptr_int32_t *)0x0)) {
        (*u->destroy_unpacked_func_ptr)(ctxt,u->unpacked_data,u->unpacked_size);
      }
      u->unpacked_data = (void *)0x0;
      u->unpacked_size = 0;
      if ((u->packed_data != (void *)0x0) && (0 < u->packed_alloc_size)) {
        (**(code **)(ctxt + 0x60))();
      }
      u->packed_data = __dest;
      u->size = sz;
      u->packed_alloc_size = sz;
      if (packed == (void *)0x0) {
        return 0;
      }
      memcpy(__dest,packed,(ulong)(uint)sz);
      return 0;
    }
    UNRECOVERED_JUMPTABLE = *(code **)(ctxt + 0x38);
    uStack_40 = 1;
  }
  eVar1 = (*UNRECOVERED_JUMPTABLE)(ctxt,uStack_40);
  return eVar1;
}

Assistant:

exr_result_t
exr_attr_opaquedata_set_packed (
    exr_context_t          ctxt,
    exr_attr_opaquedata_t* u,
    const void*            packed,
    int32_t                sz)
{
    void* nmem;
    INTERN_EXR_PROMOTE_CONTEXT_OR_ERROR (ctxt);

    if (!u) return pctxt->standard_error (pctxt, EXR_ERR_INVALID_ARGUMENT);

    /* TODO: do we care if the incoming unpacked data is null? */
    if (sz < 0)
        return pctxt->print_error (
            pctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Opaque data given invalid negative size (%d)",
            sz);

    nmem = pctxt->alloc_fn ((size_t) sz);
    if (!nmem) return pctxt->standard_error (pctxt, EXR_ERR_OUT_OF_MEMORY);

    if (u->unpacked_data)
    {
        if (u->destroy_unpacked_func_ptr)
            u->destroy_unpacked_func_ptr (
                ctxt, u->unpacked_data, u->unpacked_size);
    }
    u->unpacked_data = NULL;
    u->unpacked_size = 0;

    if (u->packed_data)
    {
        if (u->packed_alloc_size > 0) pctxt->free_fn (u->packed_data);
        u->packed_data       = NULL;
        u->size              = 0;
        u->packed_alloc_size = 0;
    }

    u->packed_data       = nmem;
    u->size              = sz;
    u->packed_alloc_size = sz;
    if (packed) memcpy ((void*) u->packed_data, packed, (size_t) sz);

    return EXR_ERR_SUCCESS;
}